

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O1

void __thiscall vector_brodnik<int>::clear(vector_brodnik<int> *this)

{
  bool bVar1;
  pointer ppiVar2;
  ulong uVar3;
  pointer ppiVar4;
  ulong uVar5;
  
  ppiVar2 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppiVar4 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppiVar4 != ppiVar2) {
    uVar3 = 0;
    uVar5 = 1;
    do {
      free(ppiVar2[uVar3]);
      ppiVar2 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppiVar4 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      bVar1 = uVar5 < (ulong)((long)ppiVar4 - (long)ppiVar2 >> 3);
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  if (ppiVar4 != ppiVar2) {
    (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar2;
  }
  this->_insertpos = (int *)0x0;
  this->_left_in_block = 0;
  this->_left_in_superblock = 8;
  this->_superblock_size = 8;
  this->_block_size = 8;
  this->_superblock = '\x06';
  return;
}

Assistant:

void clear()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos = 0;
		_left_in_block = 0;
		_left_in_superblock = InitialSuperBlocksize;
		_block_size = InitialBlocksize;
		_superblock_size = InitialSuperBlocksize;
		_superblock = InitialSuperBlock;
	}